

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptString::HasPropertyQuery
          (JavascriptString *this,PropertyId propertyId,PropertyValueInfo *info)

{
  BOOL BVar1;
  PropertyQueryFlags PVar2;
  undefined8 in_RAX;
  uint local_14 [2];
  charcount_t index;
  
  local_14[0] = (uint)((ulong)in_RAX >> 0x20);
  if (propertyId == 0xd1) {
    return Property_Found;
  }
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_14);
  if ((BVar1 == 0) || (this->m_charLength <= local_14[0])) {
    PVar2 = Property_NotFound;
  }
  else {
    PVar2 = Property_Found;
  }
  return PVar2;
}

Assistant:

PropertyQueryFlags JavascriptString::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (propertyId == PropertyIds::length)
        {
            return PropertyQueryFlags::Property_Found;
        }
        ScriptContext* scriptContext = GetScriptContext();
        charcount_t index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            if (index < this->GetLength())
            {
                return PropertyQueryFlags::Property_Found;
            }
        }
        return PropertyQueryFlags::Property_NotFound;
    }